

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_SequenceApiTestWithKey_Test::TestBody
          (TransactionContext_SequenceApiTestWithKey_Test *this)

{
  Txid *this_00;
  Txid *this_01;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  Amount AVar4;
  initializer_list<cfd::UtxoData> __l;
  allocator local_1972;
  allocator local_1971;
  AssertionResult gtest_ar_1;
  Privkey local_1950;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1930;
  string local_1918;
  ByteData tx;
  Amount fee;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SigHashType local_18b8;
  SigHashType local_18ac;
  AddressFactory factory;
  TransactionContext txc;
  Address address;
  AssertionResult gtest_ar;
  UtxoData local_1118;
  UtxoData utxo2;
  Address address2;
  UtxoData utxo1;
  
  cfd::AddressFactory::AddressFactory(&factory,kRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo2);
  this_00 = &utxo1.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",
             (allocator *)&address);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",(allocator *)&address);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,10000000);
  utxo1.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo1.amount.amount_ = gtest_ar._0_8_;
  utxo1.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&address,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address2);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&address);
  this_01 = &utxo2.txid;
  cfd::core::Txid::operator=(this_01,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  utxo2.vout = 0;
  std::__cxx11::string::string
            ((string *)&address,"a9145d54db96a28f844a744e393fcd699d6f825b284187",
             (allocator *)&address2);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&address);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",(allocator *)&address2);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&address);
  cfd::core::Address::operator=(&utxo2.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,180000);
  utxo2.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo2.amount.amount_ = gtest_ar._0_8_;
  utxo2.address_type = kP2shP2wpkhAddress;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",(allocator *)&address2);
  cfd::core::Address::Address(&address,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",(allocator *)&txc);
  cfd::core::Address::Address(&address2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Amount::Amount(&fee,10000);
  cfd::TransactionContext::TransactionContext(&txc,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput(&txc,&utxo1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1b4,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_01,utxo2.vout);
  cfd::TransactionContext::AddTxIn(&txc,(OutPoint *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  AVar4 = cfd::core::operator-(&utxo1.amount,&fee);
  gtest_ar._0_8_ = AVar4.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar4.ignore_check_;
  cfd::TransactionContext::AddTxOut(&txc,&address,(Amount *)&gtest_ar);
  cfd::TransactionContext::AddTxOut(&txc,&address2,&utxo2.amount);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(&local_1118,&utxo2);
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&gtest_ar_1);
  lVar3 = 0x528;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x528;
  } while (lVar3 != -0x528);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ba,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::ByteData::ByteData(&tx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_1,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_1971);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_1930,(string *)&gtest_ar_1);
      std::__cxx11::string::string
                ((string *)&local_1918,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_1972);
      cfd::core::Privkey::FromWif(&local_1950,&local_1918,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_18ac);
      cfd::TransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_1930,&local_1950,&local_18ac,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1950);
      std::__cxx11::string::~string((string *)&local_1918);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1930);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c1,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      cfd::TransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c2,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::TransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
    cfd::core::ByteData::operator=(&tx,(ByteData *)&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x1c4,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_01,utxo2.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_1,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_1971);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_1930,(string *)&gtest_ar_1);
      std::__cxx11::string::string
                ((string *)&local_1918,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_1972);
      cfd::core::Privkey::FromWif(&local_1950,&local_1918,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_18b8);
      cfd::TransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_1930,&local_1950,&local_18b8,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1950);
      std::__cxx11::string::~string((string *)&local_1918);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1930);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c9,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_01,utxo2.vout);
      cfd::TransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ca,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
      cfd::core::ByteData::operator=(&tx,(ByteData *)&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cb,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  AVar4 = cfd::TransactionContext::GetFeeAmount(&txc);
  gtest_ar_1._0_8_ = AVar4.amount_;
  gtest_ar_1.message_.ptr_._0_1_ = AVar4.ignore_check_;
  local_1950.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_1);
  local_1918._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&fee);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"txc.GetFeeAmount().GetSatoshiValue()","fee.GetSatoshiValue()",
             (long *)&local_1950,(long *)&local_1918);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1950,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1950);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"tx.GetHex().c_str()",
             "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
             ,(char *)gtest_ar._0_8_,
             "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1950,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1950);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::TransactionContext::~TransactionContext(&txc);
  cfd::core::Address::~Address(&address2);
  cfd::core::Address::~Address(&address);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithKey)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000");
}